

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString> *b
                    )

{
  ArrayOptions *pAVar1;
  QString *pQVar2;
  long lVar3;
  ulong uVar4;
  Data *pDVar5;
  ulong uVar6;
  long lVar7;
  char16_t *pcVar8;
  long lVar9;
  ulong uVar10;
  char16_t *__dest;
  
  lVar7 = (a->d).size;
  pDVar5 = (a->d).d;
  uVar10 = (((b->a).a)->d).size + lVar7 + (b->a).b.d.size + (b->b).d.size;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar7);
    pDVar5 = (a->d).d;
    if (pDVar5 != (Data *)0x0) goto LAB_0024bd45;
    if (uVar10 != 0) {
      uVar6 = (a->d).size;
      goto LAB_0024bd9a;
    }
  }
  else {
LAB_0024bd45:
    lVar7 = (pDVar5->super_QArrayData).alloc;
    uVar6 = (a->d).size;
    lVar9 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((long)((lVar7 - uVar6) - lVar9) < (long)uVar10) {
      uVar4 = lVar7 * 2;
      if (lVar7 * 2 < (long)uVar10) {
        uVar4 = uVar10;
      }
      uVar10 = uVar4;
      if ((1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar7 - lVar9 <= (long)uVar10)) {
LAB_0024bd9a:
        if (uVar10 < uVar6) {
          uVar10 = uVar6;
        }
        QString::reallocData((longlong)a,(AllocationOption)uVar10);
        pDVar5 = (a->d).d;
        if (pDVar5 == (Data *)0x0) goto LAB_0024bdca;
        lVar7 = (pDVar5->super_QArrayData).alloc;
      }
      if (lVar7 != 0) {
        pAVar1 = &(pDVar5->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_0024bddb;
  }
LAB_0024bdca:
  QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_0024bddb:
  __dest = (a->d).ptr + (a->d).size;
  pQVar2 = (b->a).a;
  lVar7 = (pQVar2->d).size;
  if (lVar7 != 0) {
    pcVar8 = (pQVar2->d).ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,pcVar8,lVar7 * 2);
  }
  lVar9 = (b->a).b.d.size;
  if (lVar9 != 0) {
    pcVar8 = (b->a).b.d.ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest + lVar7,pcVar8,lVar9 * 2);
  }
  lVar3 = (b->b).d.size;
  if (lVar3 != 0) {
    pcVar8 = (b->b).d.ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest + lVar7 + lVar9,pcVar8,lVar3 * 2);
  }
  QString::resize((longlong)a);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}